

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void PrintStats(int level)

{
  undefined8 __buf;
  size_t __n;
  ssize_t unused;
  TCMalloc_Printer printer;
  char *buffer;
  int kBufferSize;
  int level_local;
  
  printer._8_8_ = operator_new__(0x4000);
  TCMalloc_Printer::TCMalloc_Printer((TCMalloc_Printer *)&unused,(char *)printer._8_8_,0x4000);
  DumpStats((TCMalloc_Printer *)&unused,level);
  __buf = printer._8_8_;
  __n = strlen((char *)printer._8_8_);
  write(2,(void *)__buf,__n);
  if (printer._8_8_ != 0) {
    operator_delete__((void *)printer._8_8_);
  }
  return;
}

Assistant:

static void PrintStats(int level) {
  const int kBufferSize = 16 << 10;
  char* buffer = new char[kBufferSize];
  TCMalloc_Printer printer(buffer, kBufferSize);
  DumpStats(&printer, level);
  auto unused = write(STDERR_FILENO, buffer, strlen(buffer));
  (void)unused;
  delete[] buffer;
}